

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::ConvertLatin1ToUTF8(StringPiece *latin1,string *utf)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  byte *pbVar4;
  uint local_2c;
  int n;
  Rune r;
  size_t i;
  string *psStack_18;
  char buf [4];
  string *utf_local;
  StringPiece *latin1_local;
  
  psStack_18 = utf;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(utf);
  _n = 0;
  while( true ) {
    uVar1 = _n;
    sVar3 = StringPiece::size(latin1);
    if (sVar3 <= uVar1) break;
    pbVar4 = (byte *)StringPiece::operator[](latin1,_n);
    local_2c = (uint)*pbVar4;
    iVar2 = runetochar((char *)((long)&i + 4),(Rune *)&local_2c);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (psStack_18,(char *)((long)&i + 4),(long)iVar2);
    _n = _n + 1;
  }
  return;
}

Assistant:

void ConvertLatin1ToUTF8(const StringPiece& latin1, std::string* utf) {
  char buf[UTFmax];

  utf->clear();
  for (size_t i = 0; i < latin1.size(); i++) {
    Rune r = latin1[i] & 0xFF;
    int n = runetochar(buf, &r);
    utf->append(buf, n);
  }
}